

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall
spv::Builder::addInstructionNoDebugInfo
          (Builder *this,unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst)

{
  Block *pBVar1;
  Instruction *instruction;
  Instruction *raw_instruction;
  pointer *__ptr;
  _Head_base<0UL,_spv::Instruction_*,_false> local_18;
  
  pBVar1 = this->buildPoint;
  instruction = (inst->_M_t).
                super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
                .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
  local_18._M_head_impl = instruction;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar1->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_18);
  instruction->block = pBVar1;
  if (instruction->resultId != 0) {
    Module::mapInstruction(pBVar1->parent->parent,instruction);
  }
  if (local_18._M_head_impl != (Instruction *)0x0) {
    (*(local_18._M_head_impl)->_vptr_Instruction[1])();
  }
  return;
}

Assistant:

void Builder::addInstructionNoDebugInfo(std::unique_ptr<Instruction> inst) {
    buildPoint->addInstruction(std::move(inst));
}